

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS ref_cell_with(REF_CELL ref_cell,REF_INT *nodes,REF_INT *cell)

{
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  REF_STATUS RVar8;
  int iVar9;
  char *pcVar10;
  REF_INT cell_00;
  REF_INT ncandidate;
  REF_INT ntarget;
  REF_INT *local_190;
  REF_INT candidate [27];
  REF_INT target [27];
  REF_INT orig [27];
  
  *cell = -1;
  uVar3 = ref_sort_unique_int(ref_cell->node_per,nodes,&ntarget,target);
  if (uVar3 == 0) {
    iVar9 = *nodes;
    uVar7 = 0xffffffff;
    cell_00 = -1;
    if (-1 < (long)iVar9) {
      pRVar1 = ref_cell->ref_adj;
      uVar7 = 0xffffffff;
      cell_00 = -1;
      if (iVar9 < pRVar1->nnode) {
        uVar3 = pRVar1->first[iVar9];
        uVar7 = 0xffffffff;
        cell_00 = -1;
        if ((long)(int)uVar3 != -1) {
          cell_00 = pRVar1->item[(int)uVar3].ref;
          uVar7 = (ulong)uVar3;
        }
      }
    }
    local_190 = cell;
    while ((int)uVar7 != -1) {
      uVar3 = ref_cell_nodes(ref_cell,cell_00,orig);
      if (uVar3 != 0) {
        uVar7 = (ulong)uVar3;
        pcVar10 = "get orig";
        uVar5 = 0x4a9;
        goto LAB_00198355;
      }
      uVar3 = ref_sort_unique_int(ref_cell->node_per,orig,&ncandidate,candidate);
      if (uVar3 != 0) {
        uVar7 = (ulong)uVar3;
        pcVar10 = "canonical";
        uVar5 = 0x4ac;
        goto LAB_00198355;
      }
      if (ntarget == ncandidate) {
        uVar4 = 0;
        uVar6 = 0;
        if (0 < ntarget) {
          uVar6 = (ulong)(uint)ntarget;
        }
        iVar9 = 0;
        for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
          iVar9 = iVar9 + (uint)(target[uVar4] == candidate[uVar4]);
        }
        if (ntarget == iVar9) {
          *local_190 = cell_00;
          return 0;
        }
      }
      pRVar2 = ref_cell->ref_adj->item;
      uVar7 = (ulong)pRVar2[(int)uVar7].next;
      cell_00 = -1;
      if (uVar7 != 0xffffffffffffffff) {
        cell_00 = pRVar2[uVar7].ref;
      }
    }
    RVar8 = 5;
  }
  else {
    uVar7 = (ulong)uVar3;
    pcVar10 = "canonical";
    uVar5 = 0x4a6;
LAB_00198355:
    RVar8 = (REF_STATUS)uVar7;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar5,
           "ref_cell_with",uVar7,pcVar10);
  }
  return RVar8;
}

Assistant:

REF_FCN REF_STATUS ref_cell_with(REF_CELL ref_cell, REF_INT *nodes,
                                 REF_INT *cell) {
  REF_INT item, ref, node, same;
  REF_INT ntarget, target[REF_CELL_MAX_SIZE_PER];
  REF_INT ncandidate, candidate[REF_CELL_MAX_SIZE_PER];
  REF_INT orig[REF_CELL_MAX_SIZE_PER];

  (*cell) = REF_EMPTY;

  RSS(ref_sort_unique_int(ref_cell_node_per(ref_cell), nodes, &ntarget, target),
      "canonical");

  each_ref_adj_node_item_with_ref(ref_cell_adj(ref_cell), nodes[0], item, ref) {
    RSS(ref_cell_nodes(ref_cell, ref, orig), "get orig");
    RSS(ref_sort_unique_int(ref_cell_node_per(ref_cell), orig, &ncandidate,
                            candidate),
        "canonical");
    if (ntarget == ncandidate) {
      same = 0;
      for (node = 0; node < ntarget; node++)
        if (target[node] == candidate[node]) same++;
      if (ntarget == same) {
        (*cell) = ref;
        return REF_SUCCESS;
      }
    }
  }

  return REF_NOT_FOUND;
}